

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

void secp256k1_keyagg_cache_save
               (secp256k1_musig_keyagg_cache *cache,secp256k1_keyagg_cache_internal *cache_i)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  cache->data[0] = 0xf4;
  cache->data[1] = 0xad;
  cache->data[2] = 0xbb;
  cache->data[3] = 0xdf;
  secp256k1_ge_to_bytes(cache->data + 4,&cache_i->pk);
  secp256k1_ge_to_bytes_ext(cache->data + 0x44,&cache_i->second_pk);
  uVar1 = *(undefined8 *)cache_i->pks_hash;
  uVar2 = *(undefined8 *)(cache_i->pks_hash + 8);
  uVar3 = *(undefined8 *)(cache_i->pks_hash + 0x18);
  *(undefined8 *)(cache->data + 0x94) = *(undefined8 *)(cache_i->pks_hash + 0x10);
  *(undefined8 *)(cache->data + 0x9c) = uVar3;
  *(undefined8 *)(cache->data + 0x84) = uVar1;
  *(undefined8 *)(cache->data + 0x8c) = uVar2;
  cache->data[0xa4] = (uchar)cache_i->parity_acc;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)cache_i->tweak);
  cache->data[0xb5] = '\0';
  cache->data[0xb6] = '\0';
  cache->data[0xb7] = '\0';
  cache->data[0xb8] = '\0';
  cache->data[0xb9] = '\0';
  cache->data[0xba] = '\0';
  cache->data[0xbb] = '\0';
  cache->data[0xbc] = '\0';
  cache->data[0xbd] = '\0';
  cache->data[0xbe] = '\0';
  cache->data[0xbf] = '\0';
  cache->data[0xc0] = '\0';
  cache->data[0xc1] = '\0';
  cache->data[0xc2] = '\0';
  cache->data[0xc3] = '\0';
  cache->data[0xc4] = '\0';
  cache->data[0xa5] = '\0';
  cache->data[0xa6] = '\0';
  cache->data[0xa7] = '\0';
  cache->data[0xa8] = '\0';
  cache->data[0xa9] = '\0';
  cache->data[0xaa] = '\0';
  cache->data[0xab] = '\0';
  cache->data[0xac] = '\0';
  cache->data[0xad] = '\0';
  cache->data[0xae] = '\0';
  cache->data[0xaf] = '\0';
  cache->data[0xb0] = '\0';
  cache->data[0xb1] = '\0';
  cache->data[0xb2] = '\0';
  cache->data[0xb3] = '\0';
  cache->data[0xb4] = '\0';
  cache->data[0xc1] = *(uchar *)((long)&cache_i->tweak + 3);
  cache->data[0xc2] = *(uchar *)((long)&cache_i->tweak + 2);
  cache->data[0xc3] = *(uchar *)((long)&cache_i->tweak + 1);
  cache->data[0xc4] = (uchar)cache_i->tweak;
  return;
}

Assistant:

static void secp256k1_keyagg_cache_save(secp256k1_musig_keyagg_cache *cache, const secp256k1_keyagg_cache_internal *cache_i) {
    unsigned char *ptr = cache->data;
    memcpy(ptr, secp256k1_musig_keyagg_cache_magic, 4);
    ptr += 4;
    secp256k1_ge_to_bytes(ptr, &cache_i->pk);
    ptr += 64;
    secp256k1_ge_to_bytes_ext(ptr, &cache_i->second_pk);
    ptr += 64;
    memcpy(ptr, cache_i->pks_hash, 32);
    ptr += 32;
    *ptr = cache_i->parity_acc;
    ptr += 1;
    secp256k1_scalar_get_b32(ptr, &cache_i->tweak);
}